

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  byte bVar1;
  stbi__uint32 sVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  stbi_uc *psVar12;
  int iVar13;
  
  if (j->spec_end != 0) {
    stbi__g_failure_reason = "can\'t merge dc and ac";
    return 0;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high != 0) {
    iVar8 = j->code_bits;
    if (iVar8 < 1) {
      stbi__grow_buffer_unsafe(j);
      iVar8 = j->code_bits;
    }
    sVar2 = j->code_buffer;
    j->code_buffer = sVar2 * 2;
    j->code_bits = iVar8 + -1;
    if (-1 < (int)sVar2) {
      return 1;
    }
    *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar4 = j->code_buffer;
  uVar11 = (ulong)hdc->fast[uVar4 >> 0x17];
  if (uVar11 == 0xff) {
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      lVar7 = lVar6 + 1;
    } while (hdc->maxcode[lVar6 + 10] <= uVar4 >> 0x10);
    iVar8 = j->code_bits;
    if (lVar7 == 8) {
      iVar8 = iVar8 + -0x10;
      j->code_bits = iVar8;
    }
    else {
      uVar9 = (int)lVar6 + 10;
      if ((int)uVar9 <= iVar8) {
        uVar10 = uVar4 >> ((byte)(0x17 - (char)lVar7) & 0x1f);
        uVar3 = stbi__bmask[lVar6 + 10];
        iVar13 = iVar8 - (int)lVar7;
        uVar4 = uVar4 << (uVar9 & 0x1f);
        iVar5 = hdc->delta[lVar6 + 10];
        iVar8 = (iVar8 - (int)lVar7) + -9;
        j->code_bits = iVar13 + -9;
        j->code_buffer = uVar4;
        psVar12 = hdc->values + (int)((uVar10 & uVar3) + iVar5);
        goto LAB_00324919;
      }
    }
    uVar9 = 0xffffffff;
  }
  else {
    iVar8 = j->code_bits;
    bVar1 = hdc->size[uVar11];
    uVar9 = 0xffffffff;
    iVar5 = iVar8 - (uint)bVar1;
    if ((int)(uint)bVar1 <= iVar8) {
      uVar4 = uVar4 << (bVar1 & 0x1f);
      psVar12 = hdc->values + uVar11;
      j->code_buffer = uVar4;
      j->code_bits = iVar5;
      iVar8 = iVar5;
LAB_00324919:
      uVar9 = (uint)*psVar12;
      if (*psVar12 == 0) {
        iVar5 = 0;
        goto LAB_00324984;
      }
    }
  }
  if (iVar8 < (int)uVar9) {
    stbi__grow_buffer_unsafe(j);
    uVar4 = j->code_buffer;
    iVar8 = j->code_bits;
  }
  bVar1 = (byte)uVar9 & 0x1f;
  uVar10 = uVar4 << bVar1 | uVar4 >> 0x20 - bVar1;
  uVar3 = stbi__bmask[(int)uVar9];
  iVar5 = 0;
  j->code_buffer = ~uVar3 & uVar10;
  j->code_bits = iVar8 - uVar9;
  if (-1 < (int)uVar4) {
    iVar5 = stbi__jbias[(int)uVar9];
  }
  iVar5 = iVar5 + (uVar10 & uVar3);
LAB_00324984:
  iVar5 = iVar5 + j->img_comp[b].dc_pred;
  j->img_comp[b].dc_pred = iVar5;
  *data = (short)(iVar5 << ((byte)j->succ_low & 0x1f));
  return 1;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      diff = t ? stbi__extend_receive(j, t) : 0;

      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      data[0] = (short) (dc << j->succ_low);
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}